

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

void __thiscall
helics::Endpoint::Endpoint(Endpoint *this,MessageFederate *mFed,string_view name,string_view type)

{
  string_view type_00;
  Endpoint *in_RDX;
  Endpoint *in_R9;
  MessageFederate *in_stack_00000020;
  
  type_00._M_str = (char *)this;
  type_00._M_len = (size_t)mFed;
  helics::MessageFederate::registerEndpoint(in_stack_00000020,type,type_00);
  Endpoint(in_RDX,in_R9);
  return;
}

Assistant:

Endpoint::Endpoint(MessageFederate* mFed, std::string_view name, std::string_view type):
    Endpoint(mFed->registerEndpoint(name, type))
{
}